

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  undefined1 auVar1 [8];
  size_t sVar2;
  char *in_RDX;
  char *__s;
  undefined1 local_50 [8];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_48;
  Entry *local_38;
  
  __s = "";
  if (in_RDX != (char *)0x0) {
    __s = in_RDX;
  }
  local_48 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&local_38;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar2);
  Parse((cmGeneratorExpression *)local_50,(string *)input);
  auVar1 = local_50;
  local_50 = (undefined1  [8])0x0;
  (this->Backtrace).Bottom.State = (cmState *)auVar1;
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_50);
  if (local_48 != (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&local_38) {
    operator_delete(local_48,(ulong)((long)&(local_38->super_cmListFileContext).Name._M_dataplus.
                                            _M_p + 1));
  }
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

CM_AUTO_PTR<cmCompiledGeneratorExpression> cmGeneratorExpression::Parse(
  const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}